

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# minilua.c
# Opt level: O0

int skip_sep(LexState *ls)

{
  int iVar1;
  size_t sVar2;
  byte *pbVar3;
  int local_24;
  uint local_20;
  uint local_1c;
  int local_14;
  int s;
  int count;
  LexState *ls_local;
  
  local_14 = 0;
  iVar1 = ls->current;
  save(ls,ls->current);
  sVar2 = ls->z->n;
  ls->z->n = sVar2 - 1;
  if (sVar2 == 0) {
    local_1c = luaZ_fill(ls->z);
  }
  else {
    pbVar3 = (byte *)ls->z->p;
    ls->z->p = (char *)(pbVar3 + 1);
    local_1c = (uint)*pbVar3;
  }
  ls->current = local_1c;
  while (ls->current == 0x3d) {
    save(ls,ls->current);
    sVar2 = ls->z->n;
    ls->z->n = sVar2 - 1;
    if (sVar2 == 0) {
      local_20 = luaZ_fill(ls->z);
    }
    else {
      pbVar3 = (byte *)ls->z->p;
      ls->z->p = (char *)(pbVar3 + 1);
      local_20 = (uint)*pbVar3;
    }
    ls->current = local_20;
    local_14 = local_14 + 1;
  }
  if (ls->current == iVar1) {
    local_24 = local_14;
  }
  else {
    local_24 = -1 - local_14;
  }
  return local_24;
}

Assistant:

static int skip_sep(LexState*ls){
int count=0;
int s=ls->current;
save_and_next(ls);
while(ls->current=='='){
save_and_next(ls);
count++;
}
return(ls->current==s)?count:(-count)-1;
}